

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voting.cpp
# Opt level: O0

void __thiscall CVoting::CallvoteSpectate(CVoting *this,int ClientID,char *pReason,bool ForceVote)

{
  byte bVar1;
  byte in_CL;
  char *in_RDX;
  uint in_ESI;
  undefined8 in_RDI;
  undefined1 ForceVote_00;
  long in_FS_OFFSET;
  char aBuf [32];
  char *buffer;
  undefined7 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  char local_28 [32];
  long local_8;
  
  ForceVote_00 = (undefined1)((ulong)in_RDI >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_CL & 1;
  buffer = local_28;
  str_format(buffer,0x20,"%d",(ulong)in_ESI);
  Callvote((CVoting *)CONCAT44(in_ESI,in_stack_ffffffffffffffc8),in_RDX,
           (char *)CONCAT17(bVar1,in_stack_ffffffffffffffb8),buffer,(bool)ForceVote_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CVoting::CallvoteSpectate(int ClientID, const char *pReason, bool ForceVote)
{
	char aBuf[32];
	str_format(aBuf, sizeof(aBuf), "%d", ClientID);
	Callvote("spectate", aBuf, pReason, ForceVote);
}